

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeImageViewCreateExtPrologue
          (ZEHandleLifetimeValidation *this,ze_context_handle_t hContext,ze_device_handle_t hDevice,
          ze_image_desc_t *desc,ze_image_handle_t hImage,ze_image_handle_t *phImageView)

{
  bool bVar1;
  pointer pHVar2;
  ze_image_handle_t *phImageView_local;
  ze_image_handle_t hImage_local;
  ze_image_desc_t *desc_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  ZEHandleLifetimeValidation *this_local;
  
  pHVar2 = std::
           unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
           ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                         *)(context + 0xd48));
  bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,hContext);
  if (bVar1) {
    pHVar2 = std::
             unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
             ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                           *)(context + 0xd48));
    bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,hDevice);
    if (bVar1) {
      pHVar2 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      bVar1 = HandleLifetimeValidation::isHandleValid(pHVar2,hImage);
      if (bVar1) {
        this_local._4_4_ = ZE_RESULT_SUCCESS;
      }
      else {
        this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
      }
    }
    else {
      this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    }
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeImageViewCreateExtPrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        const ze_image_desc_t* desc,                    ///< [in] pointer to image descriptor
        ze_image_handle_t hImage,                       ///< [in] handle of image object to create view from
        ze_image_handle_t* phImageView                  ///< [out] pointer to handle of image object created for view
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hContext )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if ( !context.handleLifetime->isHandleValid( hDevice )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if ( !context.handleLifetime->isHandleValid( hImage )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }